

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

bool __thiscall
RuntimeObjectSystem::TestBuildCallback(RuntimeObjectSystem *this,char *file,TestBuildResult type)

{
  TestBuildResult type_local;
  char *file_local;
  RuntimeObjectSystem *this_local;
  
  switch(type) {
  case TESTBUILDRRESULT_SUCCESS:
    if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
      (**(code **)(*(long *)this->m_pCompilerLogger + 0x10))
                (this->m_pCompilerLogger,"TESTBUILDRRESULT_SUCCESS: %s\n",file);
    }
    break;
  case TESTBUILDRRESULT_NO_FILES_TO_BUILD:
    if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
      (**(code **)(*(long *)this->m_pCompilerLogger + 8))
                (this->m_pCompilerLogger,"TESTBUILDRRESULT_NO_FILES_TO_BUILD\n");
    }
    break;
  case TESTBUILDRRESULT_BUILD_FILE_GONE:
    if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
      (*(code *)**(undefined8 **)this->m_pCompilerLogger)
                (this->m_pCompilerLogger,"TESTBUILDRRESULT_BUILD_FILE_GONE: %s\n",file);
    }
    break;
  case TESTBUILDRRESULT_BUILD_NOT_STARTED:
    if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
      (*(code *)**(undefined8 **)this->m_pCompilerLogger)
                (this->m_pCompilerLogger,"TESTBUILDRRESULT_BUILD_NOT_STARTED: %s\n",file);
    }
    break;
  case TESTBUILDRRESULT_BUILD_FAILED:
    if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
      (*(code *)**(undefined8 **)this->m_pCompilerLogger)
                (this->m_pCompilerLogger,"TESTBUILDRRESULT_BUILD_FAILED: %s\n",file);
    }
    break;
  case TESTBUILDRRESULT_OBJECT_SWAP_FAIL:
    if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
      (*(code *)**(undefined8 **)this->m_pCompilerLogger)
                (this->m_pCompilerLogger,"TESTBUILDRRESULT_OBJECT_SWAP_FAIL: %s\n",file);
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/RuntimeObjectSystem.cpp"
                  ,0x375,
                  "virtual bool RuntimeObjectSystem::TestBuildCallback(const char *, TestBuildResult)"
                 );
  }
  return true;
}

Assistant:

bool RuntimeObjectSystem::TestBuildCallback(const char* file, TestBuildResult type)
{
    switch( type )
    {
    case TESTBUILDRRESULT_SUCCESS:            // SUCCESS, yay!
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("TESTBUILDRRESULT_SUCCESS: %s\n", file); }
        break;
    case TESTBUILDRRESULT_NO_FILES_TO_BUILD:  // file registration error or no runtime files of this type
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogWarning("TESTBUILDRRESULT_NO_FILES_TO_BUILD\n"); }
        break;
    case TESTBUILDRRESULT_BUILD_FILE_GONE:    // the file is no longer present
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_BUILD_FILE_GONE: %s\n", file); }
        break;
    case TESTBUILDRRESULT_BUILD_NOT_STARTED:  // file change detection could be broken, or if an include may not be included anywhere
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_BUILD_NOT_STARTED: %s\n", file); }
        break;
    case TESTBUILDRRESULT_BUILD_FAILED:       // a build was started, but it failed or module failed to load. See log.
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_BUILD_FAILED: %s\n", file); }
        break;
    case TESTBUILDRRESULT_OBJECT_SWAP_FAIL:   // build succeeded, module loaded but errors on swapping
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_OBJECT_SWAP_FAIL: %s\n", file); }
        break;
    default:
        assert(false);
        break;
    }
    return true;
}